

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_vector.hpp
# Opt level: O0

void __thiscall
poplar::compact_vector::compact_vector
          (compact_vector *this,uint64_t size,uint32_t width,uint64_t init)

{
  ulong in_RSI;
  undefined4 unaff_retaddr;
  uint32_t unaff_retaddr_00;
  uint64_t in_stack_00000008;
  compact_vector *in_stack_00000010;
  uint64_t i;
  undefined8 local_28;
  
  compact_vector(in_stack_00000010,in_stack_00000008,unaff_retaddr_00);
  for (local_28 = 0; local_28 < in_RSI; local_28 = local_28 + 1) {
    set(in_stack_00000010,in_stack_00000008,CONCAT44(unaff_retaddr_00,unaff_retaddr));
  }
  return;
}

Assistant:

compact_vector(uint64_t size, uint32_t width, uint64_t init) : compact_vector{size, width} {
        for (uint64_t i = 0; i < size; ++i) {
            set(i, init);
        }
    }